

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  float *pfVar2;
  void *pvVar3;
  float fVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ggml_context *pgVar7;
  long lVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  ggml_tensor *pgVar16;
  ggml_tensor *pgVar17;
  char *pcVar18;
  int i_2;
  long lVar19;
  int i;
  long lVar20;
  int i_1;
  float fVar21;
  ggml_tensor *args [5];
  float buf1_f32 [1024];
  float buf2_f32 [1024];
  float buf3_f32 [1024];
  
  lVar8 = 0;
  while (lVar8 != 0x400) {
    buf1_f32[lVar8] = (float)(int)(lVar8 + 1);
    lVar8 = lVar8 + 1;
  }
  lVar8 = 0;
  while (lVar8 != 0x400) {
    fVar21 = (float)(int)(lVar8 + 1);
    buf2_f32[lVar8] = fVar21 + fVar21;
    lVar8 = lVar8 + 1;
  }
  lVar8 = 0;
  while (lVar8 != 0x400) {
    buf3_f32[lVar8] = (float)(int)(lVar8 + 1) * 3.0;
    lVar8 = lVar8 + 1;
  }
  pgVar7 = make_ctx();
  lVar20 = 0;
  lVar8 = ggml_new_tensor_2d(pgVar7,0,10,2);
  pvVar3 = *(void **)(lVar8 + 0xf8);
  sVar9 = ggml_nbytes(lVar8);
  memcpy(pvVar3,buf1_f32,sVar9);
  uVar10 = ggml_map_custom1(pgVar7,lVar8,custom1,2,0);
  uVar11 = ggml_new_graph(pgVar7);
  ggml_build_forward_expand(uVar11,uVar10);
  ggml_graph_compute_with_ctx(pgVar7,uVar11,4);
  lVar8 = ggml_get_data_f32(uVar10);
  do {
    lVar12 = ggml_nelements(uVar10);
    if (lVar12 <= lVar20) {
      if (g_custom1_count == 2) {
        ggml_free(pgVar7);
        pgVar7 = make_ctx();
        lVar12 = 0;
        lVar8 = ggml_new_tensor_2d(pgVar7,0,10,2);
        lVar20 = ggml_new_tensor_2d(pgVar7,0,10,2);
        pvVar3 = *(void **)(lVar8 + 0xf8);
        sVar9 = ggml_nbytes(lVar8);
        memcpy(pvVar3,buf1_f32,sVar9);
        pvVar3 = *(void **)(lVar20 + 0xf8);
        sVar9 = ggml_nbytes(lVar20);
        memcpy(pvVar3,buf2_f32,sVar9);
        uVar10 = ggml_map_custom2(pgVar7,lVar8,lVar20,custom2,0xffffffffffffffff,g_userdata);
        uVar11 = ggml_new_graph(pgVar7);
        ggml_build_forward_expand(uVar11,uVar10);
        ggml_graph_compute_with_ctx(pgVar7,uVar11,4);
        lVar8 = ggml_get_data_f32(uVar10);
        goto LAB_00101df6;
      }
      pcVar18 = "g_custom1_count == 2";
      uVar10 = 0xcb;
      goto LAB_001021d2;
    }
    fVar21 = *(float *)(lVar8 + lVar20 * 4);
    fVar4 = buf1_f32[lVar20] + buf1_f32[lVar20];
    lVar20 = lVar20 + 1;
  } while ((fVar21 == fVar4) && (!NAN(fVar21) && !NAN(fVar4)));
  pcVar18 = "output[i] == buf1_f32[i] * 2";
  uVar10 = 0xc9;
  goto LAB_001021d2;
  while( true ) {
    pfVar1 = buf1_f32 + lVar12;
    pfVar2 = buf2_f32 + lVar12;
    fVar21 = *(float *)(lVar8 + lVar12 * 4);
    lVar12 = lVar12 + 1;
    if ((fVar21 != *pfVar1 + *pfVar2) || (NAN(fVar21) || NAN(*pfVar1 + *pfVar2))) break;
LAB_00101df6:
    lVar20 = ggml_nelements(uVar10);
    if (lVar20 <= lVar12) {
      if (g_custom2_count == 4) {
        ggml_free(pgVar7);
        pgVar7 = make_ctx();
        lVar19 = 0;
        lVar8 = ggml_new_tensor_2d(pgVar7,0,10,2);
        lVar20 = ggml_new_tensor_2d(pgVar7,0,10,2);
        lVar12 = ggml_new_tensor_2d(pgVar7,0,10,2);
        pvVar3 = *(void **)(lVar8 + 0xf8);
        sVar9 = ggml_nbytes(lVar8);
        memcpy(pvVar3,buf1_f32,sVar9);
        pvVar3 = *(void **)(lVar20 + 0xf8);
        sVar9 = ggml_nbytes(lVar20);
        memcpy(pvVar3,buf2_f32,sVar9);
        pvVar3 = *(void **)(lVar12 + 0xf8);
        sVar9 = ggml_nbytes(lVar12);
        memcpy(pvVar3,buf3_f32,sVar9);
        uVar10 = ggml_map_custom3(pgVar7,lVar8,lVar20,lVar12,custom3,1);
        uVar11 = ggml_new_graph(pgVar7);
        ggml_build_forward_expand(uVar11,uVar10);
        ggml_graph_compute_with_ctx(pgVar7,uVar11,4);
        lVar8 = ggml_get_data_f32(uVar10);
        goto LAB_00101f66;
      }
      pcVar18 = "g_custom2_count == 4";
      uVar10 = 0xe6;
      goto LAB_001021d2;
    }
  }
  pcVar18 = "output[i] == buf1_f32[i] + buf2_f32[i]";
  uVar10 = 0xe3;
  goto LAB_001021d2;
  while( true ) {
    fVar4 = buf1_f32[lVar19] + buf2_f32[lVar19] + buf3_f32[lVar19];
    fVar21 = *(float *)(lVar8 + lVar19 * 4);
    lVar19 = lVar19 + 1;
    if ((fVar21 != fVar4) || (NAN(fVar21) || NAN(fVar4))) break;
LAB_00101f66:
    lVar20 = ggml_nelements(uVar10);
    if (lVar20 <= lVar19) {
      if (g_custom3_count == 1) {
        ggml_free(pgVar7);
        pgVar7 = make_ctx();
        lVar20 = 0;
        pgVar13 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7,0,10,2);
        pgVar14 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7,0,10,2);
        pgVar15 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7,0,10,2);
        pgVar16 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7,0,10,2);
        pgVar17 = (ggml_tensor *)ggml_new_tensor_2d(pgVar7,0,10,2);
        pvVar3 = pgVar13->data;
        sVar9 = ggml_nbytes();
        memcpy(pvVar3,buf1_f32,sVar9);
        pvVar3 = pgVar14->data;
        sVar9 = ggml_nbytes();
        memcpy(pvVar3,buf2_f32,sVar9);
        pvVar3 = pgVar15->data;
        sVar9 = ggml_nbytes(pgVar15);
        memcpy(pvVar3,buf3_f32,sVar9);
        pvVar3 = pgVar16->data;
        sVar9 = ggml_nbytes(pgVar16);
        memcpy(pvVar3,buf1_f32,sVar9);
        pvVar3 = pgVar17->data;
        sVar9 = ggml_nbytes(pgVar17);
        memcpy(pvVar3,buf2_f32,sVar9);
        args[0] = pgVar13;
        args[1] = pgVar14;
        args[2] = pgVar15;
        args[3] = pgVar16;
        args[4] = pgVar17;
        uVar10 = ggml_custom_4d(pgVar7,0x1a,10,2,1,1,args,5,custom,0xffffffffffffffff,g_userdata);
        uVar11 = ggml_new_graph(pgVar7);
        ggml_build_forward_expand(uVar11,uVar10);
        ggml_graph_compute_with_ctx(pgVar7,uVar11,4);
        lVar8 = ggml_get_data(uVar10);
        do {
          lVar12 = ggml_nelements(uVar10);
          if (lVar12 <= lVar20) {
            ggml_free(pgVar7);
            return 0;
          }
          fVar21 = (float)*(int *)(lVar8 + lVar20 * 4);
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)buf3_f32[lVar20]),ZEXT416((uint)buf2_f32[lVar20]),
                                   ZEXT416((uint)buf1_f32[lVar20]));
          auVar5 = vfnmadd231ss_fma(auVar5,ZEXT416((uint)buf1_f32[lVar20]),
                                    ZEXT416((uint)buf2_f32[lVar20]));
          lVar20 = lVar20 + 1;
        } while ((auVar5._0_4_ == fVar21) && (!NAN(auVar5._0_4_) && !NAN(fVar21)));
        pcVar18 = "output[i] == buf1_f32[i] + buf2_f32[i] * buf3_f32[i] - buf1_f32[i] * buf2_f32[i]"
        ;
        uVar10 = 0x125;
      }
      else {
        pcVar18 = "g_custom3_count == 1";
        uVar10 = 0x104;
      }
      goto LAB_001021d2;
    }
  }
  pcVar18 = "output[i] == buf1_f32[i] + buf2_f32[i] + buf3_f32[i]";
  uVar10 = 0x101;
LAB_001021d2:
  iVar6 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
                     ,uVar10,"GGML_ASSERT(%s) failed",pcVar18);
  return iVar6;
}

Assistant:

int main(int argc, const char** argv) {

    float buf1_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf1_f32[i] = (float)(i + 1);
    }
    float buf2_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf2_f32[i] = (float)(i + 1) * 2;
    }
    float buf3_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf3_f32[i] = (float)(i + 1) * 3;
    }

    // map_custom1
    // 2 tasks, no userdata, parallelized by elements
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t->data, buf1_f32, ggml_nbytes(t));

        struct ggml_tensor * m1 = ggml_map_custom1(ctx, t, custom1, 2, NULL);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m1);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m1);

        for (int i = 0; i < ggml_nelements(m1); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] * 2);
        }
        GGML_ASSERT(g_custom1_count == 2);

        ggml_free(ctx);
    }

    // map_custom2
    // max tasks (4), userdata, parallelized by rows
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));

        struct ggml_tensor * m2 = ggml_map_custom2(ctx, t1, t2, custom2, GGML_N_TASKS_MAX, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m2);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m2);

        for (int i = 0; i < ggml_nelements(m2); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i]);
        }

        GGML_ASSERT(g_custom2_count == 4);

        ggml_free(ctx);
    }

    // map_custom3
    // 1 task, userdata, not parallelized
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t3 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);

        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));
        memcpy(t3->data, buf3_f32, ggml_nbytes(t3));

        struct ggml_tensor * m3 = ggml_map_custom3(ctx, t1, t2, t3, custom3, 1, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m3);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m3);

        for (int i = 0; i < ggml_nelements(m3); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i] + buf3_f32[i]);
        }

        GGML_ASSERT(g_custom3_count == 1);

        ggml_free(ctx);
    }

    // custom
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t3 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t4 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t5 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));
        memcpy(t3->data, buf3_f32, ggml_nbytes(t3));
        memcpy(t4->data, buf1_f32, ggml_nbytes(t4));
        memcpy(t5->data, buf2_f32, ggml_nbytes(t5));

        struct ggml_tensor * args[] = {
            t1, t2, t3, t4, t5,
        };

        struct ggml_tensor * m4 = ggml_custom_4d(ctx, GGML_TYPE_I32, 10, 2, 1, 1, args, sizeof(args)/sizeof(args[0]), custom, GGML_N_TASKS_MAX, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m4);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const int32_t * output = (const int32_t *) ggml_get_data(m4);

        for (int i = 0; i < ggml_nelements(m4); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i] * buf3_f32[i] - buf1_f32[i] * buf2_f32[i]);
        }

        ggml_free(ctx);
    }

    return 0;
}